

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
::~table_core(table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
              *this)

{
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
  *in_RDI;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
  *this_00;
  
  this_00 = in_RDI;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>>>
  ::
  for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>>>::~for_all_elements()::_lambda(std::pair<slang::ast::Symbol_const*const,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>*)_1_>
            (in_RDI,(anon_class_8_1_8991fb9c)in_RDI);
  delete_arrays(this_00,&in_RDI->arrays);
  empty_::
  empty_value<std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>,_2U,_true>
  ::~empty_value((empty_value<std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>,_2U,_true>
                  *)0x8dea98);
  return;
}

Assistant:

~table_core() noexcept {
        for_all_elements([this](element_type* p) { destroy_element(p); });
        delete_arrays(arrays);
    }